

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coolprop_tracer.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
VLEIsolineTracer<double>::get_pcvec
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          VLEIsolineTracer<double> *this)

{
  bool bVar1;
  reference pbVar2;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  value_type_conflict1 local_88 [3];
  string local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  iterator __end0;
  iterator __begin0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  VLEIsolineTracer<double> *this_local;
  vector<double,_std::allocator<double>_> *pcvec;
  
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  (*(this->super_AbstractIsolineTracer<double>).super_AbstractODEIntegrator.
    _vptr_AbstractODEIntegrator[9])(local_30);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  __end0 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_30);
  name.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&name.field_2 + 8)), bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end0);
    std::__cxx11::string::string(local_70,(string *)pbVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"pcrit",&local_a9);
    std::__cxx11::string::string(local_d0,local_70);
    local_88[0] = (value_type_conflict1)CoolProp::Props1SI(local_a8,local_d0);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,local_88);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<double> get_pcvec() const override {
        auto names = get_names();
        std::vector<double> pcvec;
        for (auto name : names) {
            pcvec.push_back(Props1SI("pcrit", name));
        }
        return pcvec;
    }